

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPFromClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPFromClause *this)

{
  pointer pcVar1;
  string clause_string;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"from ","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"(","");
  if (this->from_kind == OMPC_FROM_mapper) {
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::append((char *)&local_68);
    pcVar1 = (this->mapper_identifier)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->mapper_identifier)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_68);
  }
  if (1 < local_60) {
    std::__cxx11::string::append((char *)&local_68);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_48,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_68);
  if (3 < local_60) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPFromClause::toString() {

    std::string result = "from ";
    std::string clause_string = "(";
    OpenMPFromClauseKind from_kind = this->getKind();
    switch (from_kind) {
        case OMPC_FROM_mapper:
            clause_string += "mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
   if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}